

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimBitPacking(Gia_Man_t *p,Vec_Int_t *vCexStore,int nCexes,int nUnDecs)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *vAddOn;
  word wVar3;
  Vec_Wrd_t *p_00;
  int *pLits;
  Vec_Wrd_t *pVVar4;
  int nWords;
  uint uVar5;
  int i;
  uint nWordsUse;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  
  nWords = ((nCexes >> 6) + 1) - (uint)((nCexes & 0x3fU) == 0);
  uVar5 = p->vCis->nSize * nWords;
  vAddOn = Vec_WrdStart(uVar5);
  uVar9 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar9;
  }
  for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    wVar3 = Abc_RandomW(0);
    vAddOn->pArray[uVar9] = wVar3;
  }
  p_00 = Vec_WrdStart(p->vCis->nSize * nWords);
  iVar1 = nUnDecs + nCexes;
  uVar5 = 0;
  iVar8 = 0;
  if (0 < iVar1) {
    iVar8 = iVar1;
  }
  i = 0;
  while( true ) {
    do {
      bVar10 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      if (bVar10) {
        if (i == vCexStore->nSize) {
          nWordsUse = (((int)(uVar5 + 1) >> 6) + 1) - (uint)((uVar5 + 1 & 0x3f) == 0);
          pVVar4 = Gia_ManSimCombine(p->vCis->nSize,p->vSimsPi,vAddOn,nWordsUse);
          printf("Compressed %d CEXes into %d patterns and added %d words to available %d words.\n",
                 (ulong)(uint)nCexes,(ulong)uVar5,(ulong)nWordsUse,
                 (long)p->vSimsPi->nSize / (long)p->vCis->nSize & 0xffffffff);
          Vec_WrdFree(vAddOn);
          Vec_WrdFree(p_00);
          return pVVar4;
        }
        __assert_fail("iCur == Vec_IntSize(vCexStore)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0xf2,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)");
      }
      iVar7 = i + 1;
      Vec_IntEntry(vCexStore,i);
      i = i + 2;
      iVar7 = Vec_IntEntry(vCexStore,iVar7);
    } while (iVar7 == -1);
    pLits = Vec_IntEntryP(vCexStore,i);
    iVar2 = Gia_ManSimBitPackOne(nWords,vAddOn,p_00,uVar5,pLits,iVar7);
    uVar5 = iVar2 + uVar5;
    if (iVar1 < (int)uVar5) break;
    i = iVar7 + i;
  }
  __assert_fail("iPat <= nCexes + nUnDecs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0xef,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)");
}

Assistant:

Vec_Wrd_t * Gia_ManSimBitPacking( Gia_Man_t * p, Vec_Int_t * vCexStore, int nCexes, int nUnDecs )
{
    int c, iCur = 0, iPat = 0;
    int nWordsMax = Abc_Bit6WordNum( nCexes ); 
    Vec_Wrd_t * vSimsIn   = Vec_WrdStartRandom( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsCare = Vec_WrdStart( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsRes  = NULL;
    for ( c = 0; c < nCexes + nUnDecs; c++ )
    {
        int Out  = Vec_IntEntry( vCexStore, iCur++ );
        int Size = Vec_IntEntry( vCexStore, iCur++ );
        if ( Size == -1 )
            continue;
        iPat += Gia_ManSimBitPackOne( nWordsMax, vSimsIn, vSimsCare, iPat, Vec_IntEntryP(vCexStore, iCur), Size );
        iCur += Size;
        assert( iPat <= nCexes + nUnDecs );
        Out = 0;
    }
    assert( iCur == Vec_IntSize(vCexStore) );
    vSimsRes = Gia_ManSimCombine( Gia_ManCiNum(p), p->vSimsPi, vSimsIn, Abc_Bit6WordNum(iPat+1) );
    printf( "Compressed %d CEXes into %d patterns and added %d words to available %d words.\n", 
        nCexes, iPat, Abc_Bit6WordNum(iPat+1), Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p) );
    Vec_WrdFree( vSimsIn );
    Vec_WrdFree( vSimsCare );
    return vSimsRes;
}